

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

void __thiscall SimpleString::replace(SimpleString *this,char *to,char *with)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t n;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  char *s1;
  SimpleString *this_00;
  long lVar9;
  SimpleString local_38;
  
  SimpleString(&local_38,to);
  sVar2 = count(this,&local_38);
  ~SimpleString(&local_38);
  sVar3 = size(this);
  n = StrLen(to);
  sVar4 = StrLen(with);
  lVar5 = (sVar4 - n) * sVar2;
  sVar2 = lVar5 + sVar3 + 1;
  if (sVar2 < 2) {
    this_00 = (SimpleString *)this->buffer_;
    deallocStringBuffer((char *)this_00,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/build_O2/cpputest-master/src/CppUTest/src/CppUTest/SimpleString.cpp"
                        ,0x10e);
    pcVar6 = getEmptyString(this_00);
    this->buffer_ = pcVar6;
  }
  else {
    pcVar6 = allocStringBuffer(sVar2,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/build_O2/cpputest-master/src/CppUTest/src/CppUTest/SimpleString.cpp"
                               ,0xfc);
    lVar9 = 0;
    for (uVar8 = 0; uVar8 < sVar3; uVar8 = uVar8 + sVar2) {
      s1 = this->buffer_ + uVar8;
      iVar1 = StrNCmp(s1,to,n);
      if (iVar1 == 0) {
        StrNCpy(pcVar6 + lVar9,with,sVar4 + 1);
        sVar2 = n;
        sVar7 = sVar4;
      }
      else {
        pcVar6[lVar9] = *s1;
        sVar2 = 1;
        sVar7 = 1;
      }
      lVar9 = lVar9 + sVar7;
    }
    deallocStringBuffer(this->buffer_,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/build_O2/cpputest-master/src/CppUTest/src/CppUTest/SimpleString.cpp"
                        ,0x109);
    this->buffer_ = pcVar6;
    pcVar6[lVar5 + sVar3] = '\0';
  }
  return;
}

Assistant:

void SimpleString::replace(const char* to, const char* with)
{
    size_t c = count(to);
    size_t len = size();
    size_t tolen = StrLen(to);
    size_t withlen = StrLen(with);

    size_t newsize = len + (withlen * c) - (tolen * c) + 1;

    if (newsize > 1) {
        char* newbuf = allocStringBuffer(newsize, __FILE__, __LINE__);
        for (size_t i = 0, j = 0; i < len;) {
            if (StrNCmp(&buffer_[i], to, tolen) == 0) {
                StrNCpy(&newbuf[j], with, withlen + 1);
                j += withlen;
                i += tolen;
            }
            else {
                newbuf[j] = buffer_[i];
                j++;
                i++;
            }
        }
        deallocStringBuffer(buffer_, __FILE__, __LINE__);
        buffer_ = newbuf;
        buffer_[newsize - 1] = '\0';
    }
    else {
        deallocStringBuffer(buffer_, __FILE__, __LINE__);
        buffer_ = getEmptyString();
    }
}